

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O0

bool __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult
          (GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *this,
          CapturedVaryings *captured_data,uint index,uint texture_size)

{
  TestLog *pTVar1;
  MessageBuilder *pMVar2;
  TestError *this_00;
  MessageBuilder local_790;
  MessageBuilder local_610;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  LogSection local_440;
  uint local_400;
  uint local_3fc;
  uint i_2;
  uint i_1;
  GLint absolute_position_x;
  GLint fract_position_x;
  MessageBuilder local_270;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_b1;
  string local_b0;
  LogSection local_90;
  uint local_50;
  uint local_4c;
  uint i;
  int not_clamped_texel_index;
  GLint expected_values [4];
  GLint local_30;
  int local_2c;
  GLint y_offset;
  GLint x_offset;
  uint texture_size_local;
  uint index_local;
  CapturedVaryings *captured_data_local;
  GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *this_local;
  
  y_offset = texture_size;
  x_offset = index;
  _texture_size_local = captured_data;
  captured_data_local = (CapturedVaryings *)this;
  GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest::getOffsets
            (&this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest,&local_2c,&local_30,
             index);
  local_4c = 0xffffffff;
  local_50 = 0;
  do {
    if (3 < local_50) {
LAB_0152fc0d:
      if (local_4c == 0xffffffff) {
        pTVar1 = tcu::TestContext::getLog
                           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                            super_GPUShader5TextureGatherOffsetDepthTestBase.
                            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Unexpected sampling results",&local_b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
        tcu::LogSection::LogSection(&local_90,&local_b0,&local_e8);
        tcu::TestLog::operator<<(pTVar1,&local_90);
        tcu::LogSection::~LogSection(&local_90);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
        GPUShader5TextureGatherOffsetTestBase::logCoordinates
                  ((GPUShader5TextureGatherOffsetTestBase *)this,x_offset);
        pTVar1 = tcu::TestContext::getLog
                           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                            super_GPUShader5TextureGatherOffsetDepthTestBase.
                            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_270,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<(&local_270,(char (*) [15])"Texture size: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&y_offset);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_270);
        pTVar1 = tcu::TestContext::getLog
                           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                            super_GPUShader5TextureGatherOffsetDepthTestBase.
                            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&absolute_position_x,pTVar1,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&absolute_position_x,(char (*) [10])"Offsets: ");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2c);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_30);
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&absolute_position_x);
        GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
                  ((GPUShader5TextureGatherOffsetDepthTestBase *)this,_texture_size_local);
        pTVar1 = tcu::TestContext::getLog
                           ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                            super_GPUShader5TextureGatherOffsetDepthTestBase.
                            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(pTVar1,(EndSectionToken *)&tcu::TestLog::EndSection);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unexpected sampling results",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5TextureGatherOffset.cpp"
                   ,0xb6f);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      i_1 = _texture_size_local->without_offset[(int)local_4c] -
            checkResult::gather_offsets_x[(int)local_4c];
      i_2 = i_1 + _texture_size_local->floor_tex_coord[0] * y_offset;
      for (local_3fc = 0; local_3fc < 4; local_3fc = local_3fc + 1) {
        (&i)[local_3fc] = i_2 + checkResult::gather_offsets_x[local_3fc];
        (&i)[local_3fc] = local_2c + (&i)[local_3fc];
        clamp<int>((int *)(&i + local_3fc),0,y_offset + -1);
      }
      local_400 = 0;
      while( true ) {
        if (3 < local_400) {
          return true;
        }
        if (_texture_size_local->with_offset[local_400] != (&i)[local_400]) break;
        local_400 = local_400 + 1;
      }
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                          super_GPUShader5TextureGatherOffsetDepthTestBase.
                          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"Invalid result",&local_461);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"",&local_489);
      tcu::LogSection::LogSection(&local_440,&local_460,&local_488);
      tcu::TestLog::operator<<(pTVar1,&local_440);
      tcu::LogSection::~LogSection(&local_440);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      GPUShader5TextureGatherOffsetTestBase::logCoordinates
                ((GPUShader5TextureGatherOffsetTestBase *)this,x_offset);
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                          super_GPUShader5TextureGatherOffsetDepthTestBase.
                          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_610,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_610,(char (*) [15])"Texture size: ");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&y_offset);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_610);
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                          super_GPUShader5TextureGatherOffsetDepthTestBase.
                          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_790,pTVar1,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_790,(char (*) [10])"Offsets: ");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_2c);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a4b1eb);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_30);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_790);
      GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
                ((GPUShader5TextureGatherOffsetDepthTestBase *)this,_texture_size_local);
      pTVar1 = tcu::TestContext::getLog
                         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                          super_GPUShader5TextureGatherOffsetDepthTestBase.
                          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(pTVar1,(EndSectionToken *)&tcu::TestLog::EndSection);
      return false;
    }
    if (y_offset != _texture_size_local->without_offset[local_50]) {
      local_4c = local_50;
      goto LAB_0152fc0d;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult(const CapturedVaryings& captured_data,
																		  unsigned int index, unsigned int texture_size)
{
	/* Get offsets for vertex */
	glw::GLint x_offset;
	glw::GLint y_offset;

	getOffsets(x_offset, y_offset, index);

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values[m_n_components_per_varying];

	/* Index of first not clamped texel in without_offset set*/
	int not_clamped_texel_index = -1;

	/* X offsets of texels in 2x2 set */
	static const glw::GLint gather_offsets_x[] = { 0, 1, 1, 0 };

	/* Find first not clamped texel in without_offset set */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((int)texture_size != captured_data.without_offset[i])
		{
			not_clamped_texel_index = i;
			break;
		}
	}

	if (-1 == not_clamped_texel_index)
	{
		/* Log problem with sampler */
		m_testCtx.getLog() << tcu::TestLog::Section("Unexpected sampling results", "");

		logCoordinates(index);

		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
						   << tcu::TestLog::EndMessage;

		logVaryings(captured_data);

		m_testCtx.getLog() << tcu::TestLog::EndSection;

		TCU_FAIL("Unexpected sampling results");
	}

	/* Fraction part of position for lower left texel without_offset set */
	const glw::GLint fract_position_x =
		captured_data.without_offset[not_clamped_texel_index] - gather_offsets_x[not_clamped_texel_index];

	/* Absolute position of lower left corner in without_offset set */
	const glw::GLint absolute_position_x = fract_position_x + captured_data.floor_tex_coord[0] * (int)texture_size;

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values[i] = absolute_position_x + gather_offsets_x[i];
		expected_values[i] += x_offset;

		/* Clamp when point is outside of texture */
		clamp(expected_values[i], 0, ((glw::GLint)texture_size) - 1);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if (captured_data.with_offset[i] != expected_values[i])
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
							   << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}